

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_doors.cpp
# Opt level: O2

void __thiscall
DAnimatedDoor::DAnimatedDoor
          (DAnimatedDoor *this,sector_t *sec,line_t_conflict *line,int speed,int delay,
          FDoorAnimation *anim)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  sector_t_conflict *this_00;
  ushort uVar4;
  int iVar5;
  line_t_conflict *plVar6;
  ulong uVar7;
  double dVar8;
  FName local_34;
  
  uVar7 = 0;
  DMovingCeiling::DMovingCeiling(&this->super_DMovingCeiling,(sector_t_conflict *)sec,false);
  (this->super_DMovingCeiling).super_DMover.super_DSectorEffect.super_DThinker.super_DObject.
  _vptr_DObject = (_func_int **)&PTR_StaticType_006f2890;
  this->m_DoorAnim = anim;
  this->m_Line1 = line;
  this->m_Line2 = line;
  uVar4 = (ushort)*(undefined4 *)&sec->linecount;
  if ((short)uVar4 < 1) {
    uVar4 = 0;
  }
  do {
    plVar6 = line;
    if (uVar4 == uVar7) {
LAB_003f7dcf:
      uVar3 = line->sidedef[0]->textures[0].texture.texnum;
      line->sidedef[0]->textures[1].texture.texnum = uVar3;
      plVar6->sidedef[0]->textures[1].texture.texnum = uVar3;
      dVar8 = 64.0;
      if ((uVar3 < TexMan.Textures.Count) &&
         (TexMan.Textures.Array[(int)uVar3].Texture != (FTexture *)0x0)) {
        iVar5 = FTexture::GetScaledHeight(TexMan.Textures.Array[(int)uVar3].Texture);
        dVar8 = (double)iVar5;
        line = this->m_Line1;
        plVar6 = this->m_Line2;
      }
      this_00 = (this->super_DMovingCeiling).super_DMover.super_DSectorEffect.m_Sector;
      dVar1 = (this_00->ceilingplane).normal.Z;
      dVar2 = (this_00->ceilingplane).D;
      this->m_Status = 0;
      this->m_Speed = speed;
      this->m_Delay = delay;
      this->m_Timer = speed;
      this->m_Frame = 0;
      uVar3 = line->flags;
      this->m_SetBlocking1 = (bool)((byte)uVar3 & 1);
      this->m_SetBlocking2 = (bool)((byte)plVar6->flags & 1);
      line->flags = uVar3 | 1;
      *(byte *)&plVar6->flags = (byte)plVar6->flags | 1;
      this->m_BotDist = dVar2;
      sector_t::MoveCeiling((sector_t *)this_00,2048.0,dVar2 - dVar8 * dVar1,1);
      if ((this->m_DoorAnim->OpenSound).Index != 0) {
        SN_StartSequence((sector_t *)
                         (this->super_DMovingCeiling).super_DMover.super_DSectorEffect.m_Sector,4,
                         &local_34,1);
      }
      return;
    }
    plVar6 = sec->lines[uVar7];
    if ((plVar6 != line) &&
       (plVar6->sidedef[0]->textures[0].texture.texnum ==
        line->sidedef[0]->textures[0].texture.texnum)) {
      this->m_Line2 = plVar6;
      goto LAB_003f7dcf;
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

DAnimatedDoor::DAnimatedDoor (sector_t *sec, line_t *line, int speed, int delay, FDoorAnimation *anim)
	: DMovingCeiling (sec, false)
{
	double topdist;
	FTextureID picnum;

	m_DoorAnim = anim;

	m_Line1 = line;
	m_Line2 = line;

	for (int i = 0; i < sec->linecount; ++i)
	{
		if (sec->lines[i] == line)
			continue;

		if (sec->lines[i]->sidedef[0]->GetTexture(side_t::top) == line->sidedef[0]->GetTexture(side_t::top))
		{
			m_Line2 = sec->lines[i];
			break;
		}
	}


	picnum = m_Line1->sidedef[0]->GetTexture(side_t::top);
	m_Line1->sidedef[0]->SetTexture(side_t::mid, picnum);
	m_Line2->sidedef[0]->SetTexture(side_t::mid, picnum);

	// don't forget texture scaling here!
	FTexture *tex = TexMan[picnum];
	topdist = tex ? tex->GetScaledHeight() : 64;

	topdist = m_Sector->ceilingplane.fD() - topdist * m_Sector->ceilingplane.fC();

	m_Status = Opening;
	m_Speed = speed;
	m_Delay = delay;
	m_Timer = m_Speed;
	m_Frame = 0;
	m_SetBlocking1 = !!(m_Line1->flags & ML_BLOCKING);
	m_SetBlocking2 = !!(m_Line2->flags & ML_BLOCKING);
	m_Line1->flags |= ML_BLOCKING;
	m_Line2->flags |= ML_BLOCKING;
	m_BotDist = m_Sector->ceilingplane.fD();
	m_Sector->MoveCeiling (2048., topdist, 1);
	if (m_DoorAnim->OpenSound != NAME_None)
	{
		SN_StartSequence (m_Sector, CHAN_INTERIOR, m_DoorAnim->OpenSound, 1);
	}
}